

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

void __thiscall Analyser::addRet(Analyser *this)

{
  Instruction local_28;
  
  if (this->_currentFunctionRetType == 'i') {
    local_28._opr = ipush;
    local_28._x = 0;
    local_28._y = 0;
    local_28._paramNum = 1;
    addInstruction(this,&local_28);
    local_28._opr = iret;
    local_28._x = 0;
  }
  else {
    local_28._opr = ret;
    local_28._x = 0;
  }
  local_28._y = 0;
  local_28._paramNum = 0;
  addInstruction(this,&local_28);
  return;
}

Assistant:

void Analyser::addRet()
{
	//������
	if (_currentFunctionRetType == 'i') {
		addInstruction(Instruction(Operation::ipush, 0));
		addInstruction(Instruction(Operation::iret));
	}
	else {
		addInstruction(Instruction(Operation::ret));
	}
}